

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InvalidInputException::InvalidInputException<std::__cxx11::string>
          (InvalidInputException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string *in_RDX;
  InvalidInputException *in_RDI;
  string local_58 [32];
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *msg_00;
  
  msg_00 = in_RDX;
  ::std::__cxx11::string::string(local_58,(string *)in_RDX);
  Exception::ConstructMessage<std::__cxx11::string>(msg_00,in_stack_ffffffffffffffe0);
  InvalidInputException(in_RDI,in_RDX);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}